

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

NameSet * __thiscall
wasm::BranchUtils::BranchSeekerCache::getBranches(BranchSeekerCache *this,Expression *curr)

{
  bool bVar1;
  Expression **ppEVar2;
  pointer ppVar3;
  mapped_type *this_00;
  Iterator IVar4;
  undefined1 local_260 [8];
  NameSet selfBranches;
  BranchAccumulator childBranches;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
  local_118;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
  local_110;
  iterator iter_1;
  Expression *child;
  undefined1 local_f0 [8];
  Iterator __end2;
  undefined1 local_d0 [8];
  Iterator __begin2;
  AbstractChildIterator<wasm::ChildIterator> local_b0;
  AbstractChildIterator<wasm::ChildIterator> *local_70;
  ChildIterator *__range2;
  anon_class_8_1_f8498820 add;
  NameSet currBranches;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
  local_28;
  iterator iter;
  Expression *curr_local;
  BranchSeekerCache *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
             )(_Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
               )curr;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
       ::find(&this->branches,(key_type *)&iter);
  currBranches._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               unordered_map<wasm::Expression_*,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
               ::end(&this->branches);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
                      *)&currBranches._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false,_false>
                           *)&local_28);
    this_local = (BranchSeekerCache *)&ppVar3->second;
  }
  else {
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&add);
    __range2 = (ChildIterator *)&add;
    ChildIterator::ChildIterator
              ((ChildIterator *)&local_b0,
               (Expression *)
               iter.
               super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
               ._M_cur);
    local_70 = &local_b0;
    IVar4 = AbstractChildIterator<wasm::ChildIterator>::begin(local_70);
    __end2._8_8_ = IVar4.parent;
    __begin2.parent._0_4_ = IVar4.index;
    local_d0 = (undefined1  [8])__end2._8_8_;
    IVar4 = AbstractChildIterator<wasm::ChildIterator>::end(local_70);
    local_f0 = (undefined1  [8])IVar4.parent;
    __end2.parent._0_4_ = IVar4.index;
    while( true ) {
      bVar1 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                        ((Iterator *)local_d0,(Iterator *)local_f0);
      if (!bVar1) break;
      ppEVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                          ((Iterator *)local_d0);
      iter_1.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
                 )*ppEVar2;
      local_110._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Expression_*,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
           ::find(&this->branches,(key_type *)&iter_1);
      local_118._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Expression_*,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
           ::end(&this->branches);
      bVar1 = std::__detail::operator!=(&local_110,&local_118);
      if (bVar1) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false,_false>
                               *)&local_110);
        getBranches::anon_class_8_1_f8498820::operator()
                  ((anon_class_8_1_f8498820 *)&__range2,&ppVar3->second);
        childBranches.branches._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::
                     unordered_map<wasm::Expression_*,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                     ::erase(&this->branches,(iterator)local_110._M_cur);
      }
      else {
        BranchAccumulator::BranchAccumulator
                  ((BranchAccumulator *)
                   &selfBranches._M_t._M_impl.super__Rb_tree_header._M_node_count);
        Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
        ::walk((Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                *)&selfBranches._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (Expression **)&iter_1);
        getBranches::anon_class_8_1_f8498820::operator()
                  ((anon_class_8_1_f8498820 *)&__range2,
                   (NameSet *)
                   &childBranches.
                    super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                    .
                    super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                    .currModule);
        BranchAccumulator::~BranchAccumulator
                  ((BranchAccumulator *)
                   &selfBranches._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_d0);
    }
    ChildIterator::~ChildIterator((ChildIterator *)&local_b0);
    getUniqueTargets((NameSet *)local_260,
                     (Expression *)
                     iter.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
                     ._M_cur);
    getBranches::anon_class_8_1_f8498820::operator()
              ((anon_class_8_1_f8498820 *)&__range2,(NameSet *)local_260);
    this_00 = std::
              unordered_map<wasm::Expression_*,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
              ::operator[](&this->branches,(key_type *)&iter);
    this_local = (BranchSeekerCache *)
                 std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::operator=
                           (this_00,(set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                     *)&add);
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)local_260);
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&add);
  }
  return (NameSet *)this_local;
}

Assistant:

const NameSet& getBranches(Expression* curr) {
    auto iter = branches.find(curr);
    if (iter != branches.end()) {
      return iter->second;
    }
    NameSet currBranches;
    auto add = [&](NameSet& moreBranches) {
      // Make sure to do a fast swap for the first set of branches to arrive.
      // This helps the case of the first child being a block with a very large
      // set of names.
      if (currBranches.empty()) {
        currBranches.swap(moreBranches);
      } else {
        currBranches.insert(moreBranches.begin(), moreBranches.end());
      }
    };
    // Add from the children, which are hopefully cached.
    for (auto child : ChildIterator(curr)) {
      auto iter = branches.find(child);
      if (iter != branches.end()) {
        add(iter->second);
        // We are scanning the parent, which means we assume the child will
        // never be visited again.
        branches.erase(iter);
      } else {
        // The child was not cached. Scan it manually.
        BranchAccumulator childBranches;
        childBranches.walk(child);
        add(childBranches.branches);
        // Don't bother caching anything - we are scanning the parent, so the
        // child will presumably not be scanned again.
      }
    }
    // Finish with the parent's own branches.
    auto selfBranches = getUniqueTargets(curr);
    add(selfBranches);
    return branches[curr] = std::move(currBranches);
  }